

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O2

int AnalyzeExpressScanDataResponseRPLIDAR
              (uchar *buf,int buflen,int nb_bytes_response,int *pnbBytesToRequest,
              int *pnbBytesToDiscard)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char *__s;
  
  *pnbBytesToRequest = -1;
  *pnbBytesToDiscard = 0;
  if (nb_bytes_response - buflen != 0 && buflen <= nb_bytes_response) {
    *pnbBytesToRequest = nb_bytes_response - buflen;
    return 6;
  }
  bVar1 = *buf;
  bVar2 = buf[1];
  if ((byte)(bVar2 >> 4 | bVar1 & 0xf0) == 0xa5) {
    bVar3 = ComputeChecksumRPLIDAR(buf + 2,nb_bytes_response + -1);
    if ((byte)(bVar1 & 0xf | bVar2 << 4) == bVar3) {
      return 0;
    }
    __s = "Warning : RPLIDAR bad ChkSum. ";
  }
  else {
    __s = "Warning : RPLIDAR bad sync1 or sync2. ";
  }
  puts(__s);
  *pnbBytesToDiscard = 1;
  return 1;
}

Assistant:

inline int AnalyzeExpressScanDataResponseRPLIDAR(unsigned char* buf, int buflen, int nb_bytes_response,
	int* pnbBytesToRequest, int* pnbBytesToDiscard)
{
	unsigned char sync = 0, ChkSum = 0;

	*pnbBytesToRequest = -1;
	*pnbBytesToDiscard = 0;
	if (buflen < nb_bytes_response)
	{
		*pnbBytesToRequest = nb_bytes_response-buflen;
		return EXIT_OUT_OF_MEMORY;
	}
	sync = (buf[0] & 0xF0)|(buf[1] >> 4);
	if (sync != START_FLAG1_RPLIDAR)
	{
		printf("Warning : RPLIDAR bad sync1 or sync2. \n");
		*pnbBytesToDiscard = 1; // We are only sure that the first byte can be discarded...
		return EXIT_FAILURE;
	}
	ChkSum = (buf[1] << 4)|(buf[0] & 0x0F);
	// Force ComputeChecksumRPLIDAR() to compute until the last byte...
	if (ChkSum != ComputeChecksumRPLIDAR(buf+2, nb_bytes_response-1))
	{
		printf("Warning : RPLIDAR bad ChkSum. \n");
		*pnbBytesToDiscard = 1; // We are only sure that the first byte can be discarded...
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}